

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

void pgetrast(char *fn,uchar *hd,float *bf,int sx,int sy,int r)

{
  ssize_t sVar1;
  byte local_39;
  int local_38;
  int iStack_34;
  uchar c;
  int j;
  int i;
  int fd;
  int r_local;
  int sy_local;
  int sx_local;
  float *bf_local;
  uchar *hd_local;
  char *fn_local;
  
  i = r;
  fd = sy;
  r_local = sx;
  _sy_local = bf;
  bf_local = (float *)hd;
  hd_local = (uchar *)fn;
  j = open(fn,0);
  if (j < 1) {
    error(6);
  }
  else {
    sVar1 = read(j,bf_local,0x20);
    if (sVar1 == 0x20) {
      for (iStack_34 = 0; iStack_34 < fd; iStack_34 = iStack_34 + 1) {
        for (local_38 = 0; local_38 < r_local; local_38 = local_38 + 1) {
          sVar1 = read(j,&local_39,1);
          if (sVar1 != 1) {
            error(4);
          }
          _sy_local[i * iStack_34 + local_38] = (float)local_39;
        }
      }
    }
    else {
      error(5);
    }
  }
  close(j);
  return;
}

Assistant:

void pgetrast(fn,hd,bf,sx,sy,r)
char *fn ;
unsigned char hd[H] ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = open(fn,O_RDONLY)) > 0) { ;
    if (read(fd,hd,H) == H) {
      for (i = 0 ; i < sy ; i++) {
        for (j = 0 ; j < sx ; j++) {
          if (read(fd,&c,sizeof(c)) != 1) {
            error(4) ;
          }
          bf[r*i + j] = (float)c ;
        }
      }
    }
    else {
      error(5) ;
    }
  }
  else {
    error(6) ;
  }
  close(fd) ;
}